

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wal_replay.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLogDeserializer::ReplayEntry(WriteAheadLogDeserializer *this,WALType entry_type)

{
  int iVar1;
  InternalException *this_00;
  undefined7 in_register_00000031;
  allocator local_39;
  string local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,entry_type);
  switch(iVar1) {
  case 1:
    ReplayCreateTable(this);
    return;
  case 2:
    ReplayDropTable(this);
    return;
  case 3:
    ReplayCreateSchema(this);
    return;
  case 4:
    ReplayDropSchema(this);
    return;
  case 5:
    ReplayCreateView(this);
    return;
  case 6:
    ReplayDropView(this);
    return;
  case 7:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    goto switchD_01ad7bae_caseD_7;
  case 8:
    ReplayCreateSequence(this);
    return;
  case 9:
    ReplayDropSequence(this);
    return;
  case 10:
    ReplaySequenceValue(this);
    return;
  case 0xb:
    ReplayCreateMacro(this);
    return;
  case 0xc:
    ReplayDropMacro(this);
    return;
  case 0xd:
    ReplayCreateType(this);
    return;
  case 0xe:
    ReplayDropType(this);
    return;
  case 0x14:
    ReplayAlter(this);
    return;
  case 0x15:
    ReplayCreateTableMacro(this);
    return;
  case 0x16:
    ReplayDropTableMacro(this);
    return;
  case 0x17:
    ReplayCreateIndex(this);
    return;
  case 0x18:
    ReplayDropIndex(this);
    return;
  case 0x19:
    ReplayUseTable(this);
    return;
  case 0x1a:
    ReplayInsert(this);
    return;
  case 0x1b:
    ReplayDelete(this);
    return;
  case 0x1c:
    ReplayUpdate(this);
    return;
  case 0x1d:
    ReplayRowGroupData(this);
    return;
  default:
    if (iVar1 == 99) {
      ReplayCheckpoint(this);
      return;
    }
    if (iVar1 == 0x62) {
      ReplayVersion(this);
      return;
    }
switchD_01ad7bae_caseD_7:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_38,"Invalid WAL entry type!",&local_39);
    InternalException::InternalException(this_00,&local_38);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
}

Assistant:

void WriteAheadLogDeserializer::ReplayEntry(WALType entry_type) {
	switch (entry_type) {
	case WALType::WAL_VERSION:
		ReplayVersion();
		break;
	case WALType::CREATE_TABLE:
		ReplayCreateTable();
		break;
	case WALType::DROP_TABLE:
		ReplayDropTable();
		break;
	case WALType::ALTER_INFO:
		ReplayAlter();
		break;
	case WALType::CREATE_VIEW:
		ReplayCreateView();
		break;
	case WALType::DROP_VIEW:
		ReplayDropView();
		break;
	case WALType::CREATE_SCHEMA:
		ReplayCreateSchema();
		break;
	case WALType::DROP_SCHEMA:
		ReplayDropSchema();
		break;
	case WALType::CREATE_SEQUENCE:
		ReplayCreateSequence();
		break;
	case WALType::DROP_SEQUENCE:
		ReplayDropSequence();
		break;
	case WALType::SEQUENCE_VALUE:
		ReplaySequenceValue();
		break;
	case WALType::CREATE_MACRO:
		ReplayCreateMacro();
		break;
	case WALType::DROP_MACRO:
		ReplayDropMacro();
		break;
	case WALType::CREATE_TABLE_MACRO:
		ReplayCreateTableMacro();
		break;
	case WALType::DROP_TABLE_MACRO:
		ReplayDropTableMacro();
		break;
	case WALType::CREATE_INDEX:
		ReplayCreateIndex();
		break;
	case WALType::DROP_INDEX:
		ReplayDropIndex();
		break;
	case WALType::USE_TABLE:
		ReplayUseTable();
		break;
	case WALType::INSERT_TUPLE:
		ReplayInsert();
		break;
	case WALType::ROW_GROUP_DATA:
		ReplayRowGroupData();
		break;
	case WALType::DELETE_TUPLE:
		ReplayDelete();
		break;
	case WALType::UPDATE_TUPLE:
		ReplayUpdate();
		break;
	case WALType::CHECKPOINT:
		ReplayCheckpoint();
		break;
	case WALType::CREATE_TYPE:
		ReplayCreateType();
		break;
	case WALType::DROP_TYPE:
		ReplayDropType();
		break;
	default:
		throw InternalException("Invalid WAL entry type!");
	}
}